

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O3

void duckdb::InitializeChild(ArrowSchema *child,DuckDBArrowSchemaHolder *root_holder,string *name)

{
  reference pvVar1;
  void *local_20;
  
  child->private_data = (void *)0x0;
  child->release = ReleaseDuckDBArrowSchema;
  child->flags = 2;
  AddName((duckdb *)&local_20,name);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->owned_type_names,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_20);
  if (local_20 != (void *)0x0) {
    operator_delete__(local_20);
  }
  pvVar1 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->owned_type_names);
  child->name = (pvVar1->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
                super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl;
  child->metadata = (char *)0x0;
  child->dictionary = (ArrowSchema *)0x0;
  child->n_children = 0;
  child->children = (ArrowSchema **)0x0;
  return;
}

Assistant:

void InitializeChild(ArrowSchema &child, DuckDBArrowSchemaHolder &root_holder, const string &name = "") {
	//! Child is cleaned up by parent
	child.private_data = nullptr;
	child.release = ReleaseDuckDBArrowSchema;

	// Store the child schema
	child.flags = ARROW_FLAG_NULLABLE;
	root_holder.owned_type_names.push_back(AddName(name));

	child.name = root_holder.owned_type_names.back().get();
	child.n_children = 0;
	child.children = nullptr;
	child.metadata = nullptr;
	child.dictionary = nullptr;
}